

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O1

void __thiscall asio::detail::thread_info_base::capture_current_exception(thread_info_base *this)

{
  void *pvVar1;
  void *__tmp;
  void *local_40;
  exception_ptr local_38;
  undefined **local_30;
  void *local_28;
  
  if (this->has_pending_exception_ == 1) {
    this->has_pending_exception_ = 2;
    pvVar1 = (this->pending_exception_)._M_exception_object;
    if (pvVar1 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    local_30 = &PTR__multiple_exceptions_001b75d8;
    local_28 = pvVar1;
    std::make_exception_ptr<asio::multiple_exceptions>((multiple_exceptions *)&local_40);
    pvVar1 = local_40;
    local_40 = (void *)0x0;
    local_38._M_exception_object = (this->pending_exception_)._M_exception_object;
    (this->pending_exception_)._M_exception_object = pvVar1;
    if (local_38._M_exception_object != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    if (local_40 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    local_30 = &PTR__multiple_exceptions_001b75d8;
    if (local_28 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    std::exception::~exception((exception *)&local_30);
  }
  else if (this->has_pending_exception_ == 0) {
    this->has_pending_exception_ = 1;
    std::current_exception();
    pvVar1 = local_40;
    local_40 = (void *)0x0;
    local_38._M_exception_object = (this->pending_exception_)._M_exception_object;
    (this->pending_exception_)._M_exception_object = pvVar1;
    if (local_38._M_exception_object != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    if (local_40 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
  }
  return;
}

Assistant:

void capture_current_exception()
  {
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    switch (has_pending_exception_)
    {
    case 0:
      has_pending_exception_ = 1;
      pending_exception_ = std::current_exception();
      break;
    case 1:
      has_pending_exception_ = 2;
      pending_exception_ =
        std::make_exception_ptr<multiple_exceptions>(
            multiple_exceptions(pending_exception_));
      break;
    default:
      break;
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       // && !defined(ASIO_NO_EXCEPTIONS)
  }